

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O0

void __thiscall VFS::CVFS::CVFSDir::RenameChild(CVFSDir *this,string *Name,string *NewName)

{
  lock_guard<std::mutex> lVar1;
  __type _Var2;
  size_type sVar3;
  size_t __n;
  reference pvVar4;
  element_type *peVar5;
  shared_ptr<VFS::CVFSNode> local_a0;
  shared_ptr<VFS::CVFSNode> *local_90;
  __normal_iterator<std::shared_ptr<VFS::CVFSNode>_*,_std::vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>_>
  local_88;
  __normal_iterator<std::shared_ptr<VFS::CVFSNode>_*,_std::vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>_>
  local_80;
  const_iterator local_78;
  string local_70;
  undefined1 local_50 [8];
  value_type Child;
  size_t Pos;
  lock_guard<std::mutex> lock;
  string *NewName_local;
  string *Name_local;
  CVFSDir *this_local;
  
  lock._M_device = (mutex_type *)NewName;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&Pos,&(this->super_CVFSNode).m_UpdateLock);
  sVar3 = std::
          vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>::
          size(&this->m_Childs);
  __n = Search(this,Name,0,sVar3 - 1);
  pvVar4 = std::
           vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
           ::operator[](&this->m_Childs,__n);
  std::shared_ptr<VFS::CVFSNode>::shared_ptr((shared_ptr<VFS::CVFSNode> *)local_50,pvVar4);
  peVar5 = std::__shared_ptr_access<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_50);
  CVFSNode::Name_abi_cxx11_(&local_70,peVar5);
  _Var2 = std::operator==(&local_70,Name);
  std::__cxx11::string::~string((string *)&local_70);
  if (_Var2) {
    local_88._M_current =
         (shared_ptr<VFS::CVFSNode> *)
         std::
         vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>::
         begin(&this->m_Childs);
    local_80 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<VFS::CVFSNode>_*,_std::vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>_>
               ::operator+(&local_88,__n);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<VFS::CVFSNode>const*,std::vector<std::shared_ptr<VFS::CVFSNode>,std::allocator<std::shared_ptr<VFS::CVFSNode>>>>
    ::__normal_iterator<std::shared_ptr<VFS::CVFSNode>*>
              ((__normal_iterator<std::shared_ptr<VFS::CVFSNode>const*,std::vector<std::shared_ptr<VFS::CVFSNode>,std::allocator<std::shared_ptr<VFS::CVFSNode>>>>
                *)&local_78,&local_80);
    local_90 = (shared_ptr<VFS::CVFSNode> *)
               std::
               vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
               ::erase(&this->m_Childs,local_78);
    lVar1 = lock;
    peVar5 = std::__shared_ptr_access<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
    std::__cxx11::string::operator=((string *)&peVar5->m_Name,(string *)lVar1._M_device);
    std::shared_ptr<VFS::CVFSNode>::shared_ptr(&local_a0,(shared_ptr<VFS::CVFSNode> *)local_50);
    InternalAppendChild(this,&local_a0);
    std::shared_ptr<VFS::CVFSNode>::~shared_ptr(&local_a0);
  }
  std::shared_ptr<VFS::CVFSNode>::~shared_ptr((shared_ptr<VFS::CVFSNode> *)local_50);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&Pos);
  return;
}

Assistant:

void RenameChild(const std::string &Name, const std::string &NewName)
                    {
                        std::lock_guard<std::mutex> lock(m_UpdateLock);
                        size_t Pos = Search(Name, 0, m_Childs.size() - 1);
                        auto Child = m_Childs[Pos];
                        if(Child->Name() == Name)
                        {
                            m_Childs.erase(m_Childs.begin() + Pos); //Removes the child temporary.
                            Child->m_Name = NewName;

                            InternalAppendChild(Child);
                        }
                    }